

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryDatumSpecification.cpp
# Opt level: O0

void __thiscall
DIS::DataQueryDatumSpecification::unmarshal
          (DataQueryDatumSpecification *this,DataStream *dataStream)

{
  undefined1 local_58 [8];
  UnsignedDISInteger x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  UnsignedDISInteger x;
  size_t idx;
  DataStream *dataStream_local;
  DataQueryDatumSpecification *this_local;
  
  DataStream::operator>>(dataStream,&this->_numberOfFixedDatums);
  DataStream::operator>>(dataStream,&this->_numberOfVariableDatums);
  std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::clear
            (&this->_fixedDatumIDList);
  x._val = 0;
  x._12_4_ = 0;
  for (; (ulong)x._8_8_ < (ulong)this->_numberOfFixedDatums; x._8_8_ = x._8_8_ + 1) {
    UnsignedDISInteger::UnsignedDISInteger((UnsignedDISInteger *)local_30);
    UnsignedDISInteger::unmarshal((UnsignedDISInteger *)local_30,dataStream);
    std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::push_back
              (&this->_fixedDatumIDList,(value_type *)local_30);
    UnsignedDISInteger::~UnsignedDISInteger((UnsignedDISInteger *)local_30);
  }
  std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::clear
            (&this->_variableDatumIDList);
  x_1._val = 0;
  x_1._12_4_ = 0;
  for (; (ulong)x_1._8_8_ < (ulong)this->_numberOfVariableDatums; x_1._8_8_ = x_1._8_8_ + 1) {
    UnsignedDISInteger::UnsignedDISInteger((UnsignedDISInteger *)local_58);
    UnsignedDISInteger::unmarshal((UnsignedDISInteger *)local_58,dataStream);
    std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::push_back
              (&this->_variableDatumIDList,(value_type *)local_58);
    UnsignedDISInteger::~UnsignedDISInteger((UnsignedDISInteger *)local_58);
  }
  return;
}

Assistant:

void DataQueryDatumSpecification::unmarshal(DataStream& dataStream)
{
    dataStream >> _numberOfFixedDatums;
    dataStream >> _numberOfVariableDatums;

     _fixedDatumIDList.clear();
     for(size_t idx = 0; idx < _numberOfFixedDatums; idx++)
     {
        UnsignedDISInteger x;
        x.unmarshal(dataStream);
        _fixedDatumIDList.push_back(x);
     }

     _variableDatumIDList.clear();
     for(size_t idx = 0; idx < _numberOfVariableDatums; idx++)
     {
        UnsignedDISInteger x;
        x.unmarshal(dataStream);
        _variableDatumIDList.push_back(x);
     }
}